

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O0

void __thiscall QFileSystemTreeView::setVisibleSections(QFileSystemTreeView *this,Sections sections)

{
  bool bVar1;
  anon_class_8_1_8991fb9c *this_00;
  Int in_ESI;
  anon_class_8_1_8991fb9c resizeSection;
  anon_class_8_1_8991fb9c setSectionHidden;
  anon_class_8_1_8991fb9c isSectionHidden;
  int in_stack_ffffffffffffffb8;
  Column in_stack_ffffffffffffffbc;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffffc0;
  QFlags<QFileSystemTreeView::Section> local_30;
  QFlags<QFileSystemTreeView::Section> local_2c;
  
  local_2c.i = in_ESI;
  QFlags<QFileSystemTreeView::Section>::QFlags(&local_30,All);
  bVar1 = ::operator==(local_2c,local_30);
  if (bVar1) {
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
  }
  else {
    QFlags<QFileSystemTreeView::Section>::testFlag
              ((QFlags<QFileSystemTreeView::Section> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc);
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
    QFlags<QFileSystemTreeView::Section>::testFlag
              ((QFlags<QFileSystemTreeView::Section> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc);
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
    QFlags<QFileSystemTreeView::Section>::testFlag
              ((QFlags<QFileSystemTreeView::Section> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc);
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
    QFlags<QFileSystemTreeView::Section>::testFlag
              ((QFlags<QFileSystemTreeView::Section> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc);
    setVisibleSections::anon_class_8_1_8991fb9c::operator()
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               SUB41((uint)in_stack_ffffffffffffffb8 >> 0x18,0));
  }
  this_00 = (anon_class_8_1_8991fb9c *)QTreeView::header();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()(this_00,in_stack_ffffffffffffffbc);
  QHeaderView::setStretchLastSection(SUB81(this_00,0));
  QTreeView::header();
  QHeaderView::defaultSectionSize();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()
            (this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  QTreeView::header();
  QHeaderView::defaultSectionSize();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()
            (this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  QTreeView::header();
  QHeaderView::defaultSectionSize();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()
            (this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  QTreeView::header();
  QHeaderView::defaultSectionSize();
  setVisibleSections::anon_class_8_1_8991fb9c::operator()
            (this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void QFileSystemTreeView::setVisibleSections(QFileSystemTreeView::Sections sections) {
    const auto isSectionHidden = [this](QFileSystemTreeView::Column column) {
        return header()->isSectionHidden(static_cast<int>(column));
    };
    const auto setSectionHidden = [this](QFileSystemTreeView::Column column, bool hidden) {
        header()->setSectionHidden(static_cast<int>(column), hidden);
    };
    const auto resizeSection = [this](QFileSystemTreeView::Column column, int size) {
        header()->resizeSection(static_cast<int>(column), size);
    };

    if (sections == Sections(QFileSystemTreeView::Section::All)) {
        setSectionHidden(QFileSystemTreeView::Column::Name, false);
        setSectionHidden(QFileSystemTreeView::Column::Size, false);
        setSectionHidden(QFileSystemTreeView::Column::Type, false);
        setSectionHidden(QFileSystemTreeView::Column::LastModification, false);
    } else {
        setSectionHidden(QFileSystemTreeView::Column::Name, !sections.testFlag(QFileSystemTreeView::Section::Name));
        setSectionHidden(QFileSystemTreeView::Column::Size, !sections.testFlag(QFileSystemTreeView::Section::Size));
        setSectionHidden(QFileSystemTreeView::Column::Type, !sections.testFlag(QFileSystemTreeView::Section::Type));
        setSectionHidden(QFileSystemTreeView::Column::LastModification,
                         !sections.testFlag(QFileSystemTreeView::Section::LastModification));
    }

    header()->setStretchLastSection(isSectionHidden(QFileSystemTreeView::Column::Name));
    resizeSection(QFileSystemTreeView::Column::Name, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::Size, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::Type, header()->defaultSectionSize());
    resizeSection(QFileSystemTreeView::Column::LastModification, header()->defaultSectionSize());
}